

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

Lexeme * BinaryCache::GetLexems(char *path,uint *count)

{
  uint uVar1;
  CodeDescriptor *pCVar2;
  uint i;
  uint index;
  
  uVar1 = NULLC::GetStringHash(path);
  index = 0;
  while( true ) {
    if (DAT_00243f64 <= index) {
      return (Lexeme *)0x0;
    }
    pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    if (uVar1 == pCVar2->nameHash) break;
    index = index + 1;
  }
  pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                     ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
  *count = pCVar2->lexemeCount;
  pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                     ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
  return pCVar2->lexemes;
}

Assistant:

Lexeme* BinaryCache::GetLexems(const char* path, unsigned& count)
{
	unsigned int hash = NULLC::GetStringHash(path);
	for(unsigned int i = 0; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
		{
			count = cache[i].lexemeCount;
			return cache[i].lexemes;
		}
	}
	return NULL;
}